

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::Collator::compareUTF8
          (Collator *this,StringPiece *source,StringPiece *target,UErrorCode *status)

{
  UCollationResult UVar1;
  UCharIterator tIter;
  UCharIterator sIter;
  UCharIterator local_100;
  UCharIterator local_90;
  
  if (U_ZERO_ERROR < *status) {
    return UCOL_EQUAL;
  }
  uiter_setUTF8_63(&local_90,source->ptr_,source->length_);
  uiter_setUTF8_63(&local_100,target->ptr_,target->length_);
  UVar1 = (*(this->super_UObject)._vptr_UObject[0xc])(this,&local_90,&local_100,status);
  return UVar1;
}

Assistant:

UCollationResult Collator::compareUTF8(const StringPiece &source,
                                       const StringPiece &target,
                                       UErrorCode &status) const {
    if(U_FAILURE(status)) {
        return UCOL_EQUAL;
    }
    UCharIterator sIter, tIter;
    uiter_setUTF8(&sIter, source.data(), source.length());
    uiter_setUTF8(&tIter, target.data(), target.length());
    return compare(sIter, tIter, status);
}